

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

undefined8 __thiscall svg::Circle::toString_abi_cxx11_(Circle *this,Layout *layout)

{
  ostream *poVar1;
  Layout *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  stringstream ss;
  string *in_stack_fffffffffffffbf8;
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [39];
  allocator local_359;
  string local_358 [32];
  double local_338;
  allocator local_329;
  string local_328 [32];
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [32];
  double local_2c0;
  allocator local_2b1;
  string local_2b0 [32];
  string local_290 [8];
  string *in_stack_fffffffffffffd78;
  double *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  allocator local_269;
  string local_268 [32];
  double local_248;
  allocator local_239;
  string local_238 [32];
  string local_218 [40];
  Layout *in_stack_fffffffffffffe10;
  Fill *in_stack_fffffffffffffe18;
  string local_1e0 [32];
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [192];
  Layout *in_stack_ffffffffffffff30;
  Stroke *in_stack_ffffffffffffff38;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"circle",(allocator *)&stack0xfffffffffffffe1f);
  elemStart(in_stack_fffffffffffffbf8);
  poVar1 = std::operator<<(local_190,local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"cx",&local_239);
  local_248 = translateX(*(double *)(in_RSI + 0x58),in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"",&local_269);
  attribute<double>(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  poVar1 = std::operator<<(poVar1,local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"cy",&local_2b1);
  local_2c0 = translateY(*(double *)(in_RSI + 0x60),in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"",&local_2e1);
  attribute<double>(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  poVar1 = std::operator<<(poVar1,local_290);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"r",&local_329);
  local_338 = translateScale(*(double *)(in_RSI + 0x68),in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_358,"",&local_359);
  attribute<double>(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  poVar1 = std::operator<<(poVar1,local_308);
  Fill::toString_abi_cxx11_(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  poVar1 = std::operator<<(poVar1,local_380);
  Stroke::toString_abi_cxx11_(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  poVar1 = std::operator<<(poVar1,local_3a0);
  emptyElemEnd_abi_cxx11_();
  std::operator<<(poVar1,local_3c0);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe1f);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << elemStart("circle") << attribute("cx", translateX(center.x, layout))
                << attribute("cy", translateY(center.y, layout))
                << attribute("r", translateScale(radius, layout)) << fill.toString(layout)
                << stroke.toString(layout) << emptyElemEnd();
            return ss.str();
        }